

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O0

decNumber_conflict * decTrim(decNumber_conflict *dn,decContext *set,uint8_t all,int32_t *dropped)

{
  uint32_t uVar1;
  uint local_5c;
  int32_t maxd;
  uint32_t quot;
  uint16_t *up;
  int local_38;
  uint32_t cut;
  int32_t exp;
  int32_t d;
  int32_t *dropped_local;
  uint8_t all_local;
  decContext *set_local;
  decNumber_conflict *dn_local;
  
  *dropped = 0;
  if (((dn->bits & 0x70) == 0) && ((dn->lsu[0] & 1) == 0)) {
    if ((dn->lsu[0] != 0) || ((dn->digits != 1 || ((dn->bits & 0x70) != 0)))) {
      local_38 = dn->exponent;
      up._4_4_ = 1;
      _maxd = dn->lsu;
      cut = 0;
      do {
        if ((dn->digits + -1 <= (int)cut) ||
           ((ulong)*_maxd !=
            (ulong)((uint)(*_maxd >> ((byte)up._4_4_ & 0x1f)) * multies[up._4_4_] >> 0x11) *
            DECPOWERS[up._4_4_])) goto LAB_00fad71f;
        if ((all == '\0') && (local_38 < 1)) {
          if (local_38 == 0) {
LAB_00fad71f:
            if (cut == 0) {
              return dn;
            }
            if (set->clamp != '\0') {
              uVar1 = ((set->emax - set->digits) + 1) - dn->exponent;
              if ((int)uVar1 < 1) {
                return dn;
              }
              if ((int)uVar1 < (int)cut) {
                cut = uVar1;
              }
            }
            if (dn->digits < 0x32) {
              local_5c = (uint)""[dn->digits];
            }
            else {
              local_5c = (dn->digits + 2) / 3;
            }
            decShiftToLeast(dn->lsu,local_5c,cut);
            dn->exponent = cut + dn->exponent;
            dn->digits = dn->digits - cut;
            *dropped = cut;
            return dn;
          }
          local_38 = local_38 + 1;
        }
        up._4_4_ = up._4_4_ + 1;
        if (3 < up._4_4_) {
          _maxd = _maxd + 1;
          up._4_4_ = 1;
        }
        cut = cut + 1;
      } while( true );
    }
    dn->exponent = 0;
  }
  return dn;
}

Assistant:

static decNumber * decTrim(decNumber *dn, decContext *set, Flag all,
			   Int *dropped) {
  Int	d, exp;			   /* work */
  uInt	cut;			   /* .. */
  Unit	*up;			   /* -> current Unit */

  #if DECCHECK
  if (decCheckOperands(dn, DECUNUSED, DECUNUSED, DECUNCONT)) return dn;
  #endif

  *dropped=0;				/* assume no zeros dropped */
  if ((dn->bits & DECSPECIAL)		/* fast exit if special .. */
    || (*dn->lsu & 0x01)) return dn;	/* .. or odd */
  if (ISZERO(dn)) {			/* .. or 0 */
    dn->exponent=0;			/* (sign is preserved) */
    return dn;
    }

  /* have a finite number which is even */
  exp=dn->exponent;
  cut=1;			   /* digit (1-DECDPUN) in Unit */
  up=dn->lsu;			   /* -> current Unit */
  for (d=0; d<dn->digits-1; d++) { /* [don't strip the final digit] */
    /* slice by powers */
    #if DECDPUN<=4
      uInt quot=QUOT10(*up, cut);
      if ((*up-quot*powers[cut])!=0) break;  /* found non-0 digit */
    #else
      if (*up%powers[cut]!=0) break;	     /* found non-0 digit */
    #endif
    /* have a trailing 0 */
    if (!all) {			   /* trimming */
      /* [if exp>0 then all trailing 0s are significant for trim] */
      if (exp<=0) {		   /* if digit might be significant */
	if (exp==0) break;	   /* then quit */
	exp++;			   /* next digit might be significant */
	}
      }
    cut++;			   /* next power */
    if (cut>DECDPUN) {		   /* need new Unit */
      up++;
      cut=1;
      }
    } /* d */
  if (d==0) return dn;		   /* none to drop */

  /* may need to limit drop if clamping */
  if (set->clamp) {
    Int maxd=set->emax-set->digits+1-dn->exponent;
    if (maxd<=0) return dn;	   /* nothing possible */
    if (d>maxd) d=maxd;
    }

  /* effect the drop */
  decShiftToLeast(dn->lsu, D2U(dn->digits), d);
  dn->exponent+=d;		   /* maintain numerical value */
  dn->digits-=d;		   /* new length */
  *dropped=d;			   /* report the count */
  return dn;
  }